

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

Config * flatbuffers::anon_unknown_26::RustDefaultConfig(void)

{
  Config *in_RDI;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  string *local_48;
  string *local_40;
  string *local_38;
  
  in_RDI->types = kKeep;
  in_RDI->constants = kScreamingSnake;
  in_RDI->methods = kSnake;
  in_RDI->functions = kSnake;
  in_RDI->fields = kKeep;
  in_RDI->variables = kUnknown;
  in_RDI->variants = kKeep;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->enum_variant_seperator,"::",&local_49);
  in_RDI->escape_keywords = BeforeConvertingCase;
  in_RDI->namespaces = kSnake;
  local_38 = &in_RDI->enum_variant_seperator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->namespace_seperator,"::",&local_4a);
  local_40 = &in_RDI->namespace_seperator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->object_prefix,"",&local_4b);
  local_48 = &in_RDI->object_prefix;
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->object_suffix,"T",&local_4c)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->keyword_prefix,"",&local_4d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->keyword_suffix,"_",&local_4e);
  in_RDI->filenames = kSnake;
  in_RDI->directories = kSnake;
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->output_path,"",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->filename_suffix,"_generated",&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->filename_extension,".rs",&local_51);
  return in_RDI;
}

Assistant:

static Namer::Config RustDefaultConfig() {
  // Historical note: We've been using "keep" casing since the original
  // implementation, presumably because Flatbuffers schema style and Rust style
  // roughly align. We are not going to enforce proper casing since its an
  // unnecessary breaking change.
  return { /*types=*/Case::kKeep,
           /*constants=*/Case::kScreamingSnake,
           /*methods=*/Case::kSnake,
           /*functions=*/Case::kSnake,
           /*fields=*/Case::kKeep,
           /*variables=*/Case::kUnknown,  // Unused.
           /*variants=*/Case::kKeep,
           /*enum_variant_seperator=*/"::",
           /*escape_keywords=*/Namer::Config::Escape::BeforeConvertingCase,
           /*namespaces=*/Case::kSnake,
           /*namespace_seperator=*/"::",
           /*object_prefix=*/"",
           /*object_suffix=*/"T",
           /*keyword_prefix=*/"",
           /*keyword_suffix=*/"_",
           /*filenames=*/Case::kSnake,
           /*directories=*/Case::kSnake,
           /*output_path=*/"",
           /*filename_suffix=*/"_generated",
           /*filename_extension=*/".rs" };
}